

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,char_const(&)[9]>
          (pybind11 *this,char (*args_) [9])

{
  array<pybind11::object,_1UL> aVar1;
  cast_error *this_00;
  value_type *arg_value;
  array<pybind11::object,_1UL> args;
  
  args._M_elems[0].super_handle.m_ptr =
       (_Type)detail::type_caster<char,_void>::cast(*args_,automatic_reference,(handle)0x0);
  if (args._M_elems[0].super_handle.m_ptr != (object)0x0) {
    tuple::tuple((tuple *)this,1);
    aVar1._M_elems[0].super_handle.m_ptr = args._M_elems[0].super_handle.m_ptr;
    args._M_elems[0].super_handle.m_ptr = (_Type)(object)0x0;
    (*(_Type *)(*(long *)this + 0x18))[0] = (object)aVar1._M_elems[0].super_handle.m_ptr;
    object::~object(args._M_elems);
    return (object)(object)this;
  }
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  cast_error::runtime_error
            (this_00,
             "make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)"
            );
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}